

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunked_sequence.hpp
# Opt level: O1

void __thiscall
pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::clear
          (chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL> *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  std::__cxx11::
  _List_base<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk,_std::allocator<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk>_>
  ::_M_clear((_List_base<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk,_std::allocator<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk>_>
              *)this);
  (this->chunks_).
  super__List_base<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk,_std::allocator<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  (this->chunks_).
  super__List_base<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk,_std::allocator<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  (this->chunks_).
  super__List_base<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk,_std::allocator<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk>_>
  ._M_impl._M_node._M_size = 0;
  p_Var2 = (_List_node_base *)operator_new(0x57feb8);
  p_Var2[1]._M_next = (_List_node_base *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->chunks_).
            super__List_base<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk,_std::allocator<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunk>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  this->size_ = 0;
  return;
}

Assistant:

void clear () {
            chunks_.clear ();
            // Ensure that there's always at least one chunk.
            chunks_.emplace_back ();
            size_ = 0;
        }